

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.cxx
# Opt level: O3

bool __thiscall
cmUtilitySourceCommand::InitialPass
          (cmUtilitySourceCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmUtilitySourceCommand *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  string *psVar9;
  cmState *this_00;
  long *plVar10;
  string *psVar11;
  char *__s;
  size_type *psVar12;
  long *plVar13;
  string utilitySource;
  string exePath;
  string utilityDirectory;
  string utilityExecutable;
  string local_170;
  undefined1 *local_150;
  char *local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  string local_130;
  string local_110;
  string *local_f0;
  cmUtilitySourceCommand *local_e8;
  long *local_e0 [2];
  long local_d0 [2];
  long *local_c0;
  long local_b8;
  long local_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  string *local_a0;
  ulong local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  psVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_98 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar9;
  if (local_98 < 0x41) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p == &local_170.field_2) goto LAB_002fe51f;
  }
  else {
    local_f0 = psVar9;
    pcVar8 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,psVar9);
    pcVar2 = (this->super_cmCommand).Makefile;
    paVar1 = &local_170.field_2;
    local_170._M_dataplus._M_p = (pointer)paVar1;
    local_e8 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"CMAKE_CFG_INTDIR","");
    psVar9 = cmMakefile::GetRequiredDefinition(pcVar2,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (local_e8->super_cmCommand).Makefile;
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"CMAKE_CROSSCOMPILING","");
    bVar5 = cmMakefile::IsOn(pcVar2,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      if (pcVar8 != (char *)0x0) goto LAB_002fe51f;
      local_170._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,"UTILITY_SOURCE is used in cross compiling mode for ","");
      std::__cxx11::string::_M_append((char *)&local_170,(ulong)(local_f0->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_170);
      cmSystemTools::Message(&local_170,"Warning");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar1) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      this_00 = cmMakefile::GetState((local_e8->super_cmCommand).Makefile);
      if (((pcVar8 != (char *)0x0) &&
          (((pcVar8 = strstr(pcVar8,"(IntDir)"), pcVar8 == (char *)0x0 ||
            (iVar6 = std::__cxx11::string::compare((char *)psVar9), iVar6 == 0)) &&
           (uVar7 = cmState::GetCacheMajorVersion(this_00), uVar7 != 0)))) &&
         (uVar7 = cmState::GetCacheMinorVersion(this_00), uVar7 != 0)) goto LAB_002fe51f;
    }
    psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((local_e8->super_cmCommand).Makefile);
    pcVar3 = (psVar9->_M_dataplus)._M_p;
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar3,pcVar3 + psVar9->_M_string_length);
    local_150 = &local_140;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + local_170._M_string_length);
    std::__cxx11::string::append((char *)&local_150);
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_150,(ulong)local_f0[2]._M_dataplus._M_p);
    psVar12 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_130.field_2._M_allocated_capacity = *psVar12;
      local_130.field_2._8_8_ = plVar10[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar12;
      local_130._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_130._M_string_length = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
    }
    bVar5 = cmsys::SystemTools::FileExists(&local_170);
    if (bVar5) {
      local_a0 = local_f0 + 2;
      psVar9 = local_f0 + 3;
      do {
        pcVar4 = local_e8;
        if (psVar9 == (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          pcVar2 = (local_e8->super_cmCommand).Makefile;
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,"CMAKE_CFG_INTDIR","");
          psVar9 = cmMakefile::GetRequiredDefinition(pcVar2,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          psVar11 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                              ((pcVar4->super_cmCommand).Makefile);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          pcVar3 = (psVar11->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar3,pcVar3 + psVar11->_M_string_length);
          local_150 = &local_140;
          local_148 = (char *)0x0;
          local_140 = 0;
          pcVar2 = (pcVar4->super_cmCommand).Makefile;
          paVar1 = &local_110.field_2;
          local_110._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"EXECUTABLE_OUTPUT_PATH","");
          pcVar8 = cmMakefile::GetDefinition(pcVar2,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar1) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if (pcVar8 != (char *)0x0) {
            pcVar2 = (pcVar4->super_cmCommand).Makefile;
            local_110._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,"EXECUTABLE_OUTPUT_PATH","");
            __s = cmMakefile::GetDefinition(pcVar2,&local_110);
            pcVar8 = local_148;
            strlen(__s);
            std::__cxx11::string::_M_replace((ulong)&local_150,0,pcVar8,(ulong)__s);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != paVar1) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_148 == (char *)0x0) {
            std::operator+(&local_110,"/",local_a0);
            psVar11 = local_f0;
            std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_110._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != paVar1) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            std::__cxx11::string::_M_assign((string *)&local_130);
            psVar11 = local_f0;
          }
          local_e0[0] = local_d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_e0,local_130._M_dataplus._M_p,
                     local_130._M_dataplus._M_p + local_130._M_string_length);
          std::__cxx11::string::append((char *)local_e0);
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)local_e0,(ulong)(psVar9->_M_dataplus)._M_p);
          plVar13 = plVar10 + 2;
          if ((long *)*plVar10 == plVar13) {
            local_80 = *plVar13;
            lStack_78 = plVar10[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *plVar13;
            local_90 = (long *)*plVar10;
          }
          local_88 = plVar10[1];
          *plVar10 = (long)plVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar13 = plVar10 + 2;
          if ((long *)*plVar10 == plVar13) {
            local_60 = *plVar13;
            lStack_58 = plVar10[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar13;
            local_70 = (long *)*plVar10;
          }
          local_68 = plVar10[1];
          *plVar10 = (long)plVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_70,(ulong)psVar11[1]._M_dataplus._M_p);
          plVar13 = plVar10 + 2;
          if ((long *)*plVar10 == plVar13) {
            local_b0 = *plVar13;
            uStack_a8 = (undefined4)plVar10[3];
            uStack_a4 = *(undefined4 *)((long)plVar10 + 0x1c);
            local_c0 = &local_b0;
          }
          else {
            local_b0 = *plVar13;
            local_c0 = (long *)*plVar10;
          }
          local_b8 = plVar10[1];
          *plVar10 = (long)plVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          pcVar2 = (local_e8->super_cmCommand).Makefile;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"CMAKE_EXECUTABLE_SUFFIX","");
          cmMakefile::GetDefinition(pcVar2,&local_50);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_c0);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          psVar12 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_110.field_2._M_allocated_capacity = *psVar12;
            local_110.field_2._8_8_ = plVar10[3];
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar12;
            local_110._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_110._M_string_length = plVar10[1];
          *plVar10 = (long)psVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_c0 != &local_b0) {
            operator_delete(local_c0,local_b0 + 1);
          }
          pcVar4 = local_e8;
          if (local_70 != &local_60) {
            operator_delete(local_70,local_60 + 1);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_e0[0] != local_d0) {
            operator_delete(local_e0[0],local_d0[0] + 1);
          }
          cmsys::SystemTools::ReplaceString(&local_110,"/./","/");
          cmMakefile::AddCacheDefinition
                    ((pcVar4->super_cmCommand).Makefile,local_f0,local_110._M_dataplus._M_p,
                     "Path to an internal program.",FILEPATH,false);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_110);
          cmMakefile::AddCacheDefinition
                    ((pcVar4->super_cmCommand).Makefile,&local_110,local_f0[1]._M_dataplus._M_p,
                     "Executable to project name.",INTERNAL,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if (local_150 != &local_140) {
            operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        local_150 = &local_140;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,local_170._M_dataplus._M_p,
                   local_170._M_dataplus._M_p + local_170._M_string_length);
        std::__cxx11::string::append((char *)&local_150);
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_150,(ulong)(psVar9->_M_dataplus)._M_p);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_130.field_2._M_allocated_capacity = *psVar12;
          local_130.field_2._8_8_ = plVar10[3];
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar12;
          local_130._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_130._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if (local_150 != &local_140) {
          operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
        }
        bVar5 = cmsys::SystemTools::FileExists(&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        psVar9 = psVar9 + 1;
      } while (bVar5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p == &local_170.field_2) goto LAB_002fe51f;
  }
  operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
LAB_002fe51f:
  return 0x40 < local_98;
}

Assistant:

bool cmUtilitySourceCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::vector<std::string>::const_iterator arg = args.begin();

  // The first argument is the cache entry name.
  std::string const& cacheEntry = *arg++;
  const char* cacheValue = this->Makefile->GetDefinition(cacheEntry);
  // If it exists already and appears up to date then we are done.  If
  // the string contains "(IntDir)" but that is not the
  // CMAKE_CFG_INTDIR setting then the value is out of date.
  std::string const& intDir =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");

  bool haveCacheValue = false;
  if (this->Makefile->IsOn("CMAKE_CROSSCOMPILING")) {
    haveCacheValue = (cacheValue != nullptr);
    if (!haveCacheValue) {
      std::string msg = "UTILITY_SOURCE is used in cross compiling mode for ";
      msg += cacheEntry;
      msg += ". If your intention is to run this executable, you need to "
             "preload the cache with the full path to a version of that "
             "program, which runs on this build machine.";
      cmSystemTools::Message(msg, "Warning");
    }
  } else {
    cmState* state = this->Makefile->GetState();
    haveCacheValue = (cacheValue &&
                      (strstr(cacheValue, "(IntDir)") == nullptr ||
                       (intDir == "$(IntDir)")) &&
                      (state->GetCacheMajorVersion() != 0 &&
                       state->GetCacheMinorVersion() != 0));
  }

  if (haveCacheValue) {
    return true;
  }

  // The second argument is the utility's executable name, which will be
  // needed later.
  std::string const& utilityName = *arg++;

  // The third argument specifies the relative directory of the source
  // of the utility.
  std::string const& relativeSource = *arg++;
  std::string utilitySource = this->Makefile->GetCurrentSourceDirectory();
  utilitySource = utilitySource + "/" + relativeSource;

  // If the directory doesn't exist, the source has not been included.
  if (!cmSystemTools::FileExists(utilitySource)) {
    return true;
  }

  // Make sure all the files exist in the source directory.
  while (arg != args.end()) {
    std::string file = utilitySource + "/" + *arg++;
    if (!cmSystemTools::FileExists(file)) {
      return true;
    }
  }

  // The source exists.
  const std::string& cmakeCFGout =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");
  std::string utilityDirectory = this->Makefile->GetCurrentBinaryDirectory();
  std::string exePath;
  if (this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH")) {
    exePath = this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
  }
  if (!exePath.empty()) {
    utilityDirectory = exePath;
  } else {
    utilityDirectory += "/" + relativeSource;
  }

  // Construct the cache entry for the executable's location.
  std::string utilityExecutable = utilityDirectory + "/" + cmakeCFGout + "/" +
    utilityName + this->Makefile->GetDefinition("CMAKE_EXECUTABLE_SUFFIX");

  // make sure we remove any /./ in the name
  cmSystemTools::ReplaceString(utilityExecutable, "/./", "/");

  // Enter the value into the cache.
  this->Makefile->AddCacheDefinition(cacheEntry, utilityExecutable.c_str(),
                                     "Path to an internal program.",
                                     cmStateEnums::FILEPATH);
  // add a value into the cache that maps from the
  // full path to the name of the project
  cmSystemTools::ConvertToUnixSlashes(utilityExecutable);
  this->Makefile->AddCacheDefinition(utilityExecutable, utilityName.c_str(),
                                     "Executable to project name.",
                                     cmStateEnums::INTERNAL);

  return true;
}